

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O1

void __thiscall
Centaurus::Grammar<char>::print(Grammar<char> *this,wostream *os,Identifier *key,int maxdepth)

{
  long *plVar1;
  wostream *pwVar2;
  wchar_t wVar3;
  ATNPrinter<char> printer;
  ATNPrinter<char> local_60;
  
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"digraph ",8);
  pwVar2 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,(key->m_id)._M_dataplus._M_p,(key->m_id)._M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar2,L" {",2);
  plVar1 = *(long **)(pwVar2 + *(long *)(*(long *)pwVar2 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar2);
    std::wostream::flush();
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"rankdir=\"LR\";",0xd);
    plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      wVar3 = (wchar_t)os;
      std::wostream::put(wVar3);
      std::wostream::flush();
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,L"graph [ charset=\"UTF-8\" ];",0x1a);
      plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put(wVar3);
        std::wostream::flush();
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                  (os,L"node [ style=\"solid,filled\" ];",0x1e);
        plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 0x50))(plVar1,10);
          std::wostream::put(wVar3);
          std::wostream::flush();
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                    (os,L"edge [ style=\"solid\" ];",0x17);
          plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x50))(plVar1,10);
            std::wostream::put(wVar3);
            std::wostream::flush();
            local_60.m_networks = &this->m_networks;
            local_60._vptr_ATNPrinter = (_func_int **)&PTR__ATNPrinter_001859c8;
            local_60.m_stack.
            super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_60.m_stack.
            super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
            _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
            local_60.m_stack.
            super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
            _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
            local_60.m_stack.
            super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_60._36_8_ = 0;
            local_60.m_maxdepth = maxdepth;
            ATNPrinter<char>::print(&local_60,os,key);
            std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
            plVar1 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
            if (plVar1 != (long *)0x0) {
              (**(code **)(*plVar1 + 0x50))(plVar1,10);
              std::wostream::put(wVar3);
              std::wostream::flush();
              local_60._vptr_ATNPrinter = (_func_int **)&PTR__ATNPrinter_001859c8;
              std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::~vector
                        (&local_60.m_stack);
              return;
            }
            std::__throw_bad_cast();
          }
        }
      }
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void print(std::wostream& os, const Identifier& key, int maxdepth = 3) const
	{
		os << L"digraph " << key << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		ATNPrinter<TCHAR> printer(m_networks, maxdepth);

		printer.print(os, key);

		os << L"}" << std::endl;
	}